

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::FindWindowDisplayIndex(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **it;
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow *local_10;
  
  this = &GImGui->Windows;
  it = ImVector<ImGuiWindow_*>::find(this,&local_10);
  iVar1 = ImVector<ImGuiWindow_*>::index_from_ptr(this,it);
  return iVar1;
}

Assistant:

int ImGui::FindWindowDisplayIndex(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    return g.Windows.index_from_ptr(g.Windows.find(window));
}